

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86rapass.cpp
# Opt level: O3

Error __thiscall
asmjit::_abi_1_10::x86::X86RAPass::_rewrite(X86RAPass *this,BaseNode *first,BaseNode *stop)

{
  int *piVar1;
  byte bVar2;
  byte bVar3;
  uint uVar4;
  uint uVar5;
  BaseNode *pBVar6;
  long *plVar7;
  BaseBuilder *pBVar8;
  long lVar9;
  byte *pbVar10;
  BaseNode *pBVar11;
  uint uVar12;
  byte bVar13;
  bool bVar14;
  undefined4 uVar15;
  Error EVar16;
  int iVar17;
  uint uVar18;
  ulong uVar19;
  long lVar20;
  undefined1 auVar21 [16];
  undefined4 local_40;
  uint32_t local_3c;
  undefined8 local_38;
  
  if (first != stop) {
    uVar4 = *(uint *)&(this->super_BaseRAPass).super_FuncPass.super_Pass._cb[1].super_BaseEmitter.
                      _code;
    do {
      pBVar6 = (first->field_0).field_0._next;
      if (((first->field_1)._any._nodeFlags & kActsAsInst) != kNone) {
        plVar7 = (long *)first->_passData;
        bVar2 = (first->field_1)._any._reserved0;
        if (plVar7 != (long *)0x0) {
          first->_passData = (void *)0x0;
          uVar5 = *(uint *)(plVar7 + 2);
          if ((ulong)uVar5 != 0) {
            uVar19 = 0;
            bVar13 = 0;
            do {
              lVar20 = uVar19 * 0x20;
              uVar18 = *(uint *)((long)plVar7 + lVar20 + 100);
              if (uVar18 != 0) {
                bVar3 = *(byte *)((long)plVar7 + lVar20 + 0x5a);
                do {
                  if (bVar13 <= bVar3) {
                    bVar13 = bVar3;
                  }
                  uVar12 = 0;
                  if (uVar18 != 0) {
                    for (; (uVar18 >> uVar12 & 1) == 0; uVar12 = uVar12 + 1) {
                    }
                  }
                  *(uint *)((long)&first[1].field_0 + (ulong)uVar12 * 4 + 0xc) = (uint)bVar3;
                  uVar18 = uVar18 - 1 & uVar18;
                } while (uVar18 != 0);
              }
              uVar18 = *(uint *)(plVar7 + uVar19 * 4 + 0xd);
              if (uVar18 != 0) {
                bVar3 = *(byte *)((long)plVar7 + lVar20 + 0x5b);
                do {
                  if (bVar13 <= bVar3) {
                    bVar13 = bVar3;
                  }
                  uVar12 = 0;
                  if (uVar18 != 0) {
                    for (; (uVar18 >> uVar12 & 1) == 0; uVar12 = uVar12 + 1) {
                    }
                  }
                  *(uint *)((long)&first[1].field_0 + (ulong)uVar12 * 4 + 0xc) = (uint)bVar3;
                  uVar18 = uVar18 - 1 & uVar18;
                } while (uVar18 != 0);
              }
              uVar19 = uVar19 + 1;
            } while (uVar19 != uVar5);
            if ((*(int *)((long)plVar7 + 0xc) < 0) && (0xf < bVar13)) {
              iVar17 = *(int *)&first[1].field_0;
              if (iVar17 < 0x4c8) {
                if (iVar17 < 0x45f) {
                  if (iVar17 < 0x3b1) {
                    uVar15 = 0x33e;
                    if (iVar17 != 0x33c) {
                      if (iVar17 != 0x342) {
LAB_00147849:
                        DebugUtils::assertionFailed
                                  ("/workspace/llm4binary/github/license_c_cmakelists/mitsuba-renderer[P]asmjit/src/asmjit/x86/x86rapass.cpp"
                                   ,0x4eb,"false");
                      }
                      uVar15 = 0x344;
                    }
                  }
                  else if (iVar17 == 0x3b1) {
                    uVar15 = 0x3b2;
                  }
                  else {
                    if (iVar17 != 0x3b6) goto LAB_00147849;
                    uVar15 = 0x3b7;
                  }
                }
                else if (iVar17 < 0x485) {
                  if (iVar17 == 0x45f) {
                    uVar15 = 0x460;
                  }
                  else {
                    if (iVar17 != 0x464) goto LAB_00147849;
                    uVar15 = 0x465;
                  }
                }
                else if (iVar17 == 0x485) {
                  uVar15 = 0x486;
                }
                else {
                  if (iVar17 != 0x488) goto LAB_00147849;
                  uVar15 = 0x48a;
                }
              }
              else if (iVar17 < 0x5fb) {
                if (iVar17 == 0x4c8) {
                  uVar15 = 0x4c9;
                }
                else if (iVar17 == 0x4ca) {
                  uVar15 = 0x4cb;
                }
                else {
                  if (iVar17 != 0x59b) goto LAB_00147849;
                  uVar15 = 0x59c;
                }
              }
              else {
                switch(iVar17) {
                case 0x61a:
                  uVar15 = 0x614;
                  break;
                case 0x61b:
                  uVar15 = 0x616;
                  break;
                case 0x61c:
                  uVar15 = 0x617;
                  break;
                case 0x61d:
                  uVar15 = 0x619;
                  break;
                default:
                  if (iVar17 != 0x5fb) goto LAB_00147849;
                  uVar15 = 0x5fc;
                }
              }
              *(undefined4 *)&first[1].field_0 = uVar15;
            }
          }
          if (((*(byte *)(plVar7 + 1) & 1) != 0) &&
             (bVar2 == 2 && *(int *)((long)&first[1].field_0 + 8) == 0)) {
            bVar13 = (first->field_1)._any._reserved1;
            if ((bVar13 == 0) || (bVar13 == 1)) {
LAB_00147831:
              DebugUtils::assertionFailed
                        ("/workspace/llm4binary/github/license_c_cmakelists/mitsuba-renderer[P]asmjit/src/asmjit/x86/../x86/../core/../core/builder.h"
                         ,0x325,"index < opCapacity()");
            }
            auVar21._0_4_ =
                 -(uint)(*(anon_union_4_5_b2977b59_for_BaseNode_2 *)&first[1]._passData ==
                        first[1].field_1);
            auVar21._4_4_ =
                 -(uint)(*(uint32_t *)((long)&first[1]._passData + 4) == first[1]._position);
            auVar21._8_4_ = -(uint)(*(int *)&first[1]._inlineComment == *(int *)&first[1].field_3);
            auVar21._12_4_ =
                 -(uint)(*(int *)((long)&first[1]._inlineComment + 4) ==
                        *(int *)((long)&first[1].field_3 + 4));
            iVar17 = movmskps((uint)bVar13,auVar21);
            if (iVar17 == 0xf) {
              BaseBuilder::removeNode((this->super_BaseRAPass).super_FuncPass.super_Pass._cb,first);
              goto LAB_00147747;
            }
          }
          if ((first->field_1)._any._nodeType == kFuncRet) {
            lVar20 = *plVar7;
            bVar14 = BaseRAPass::isNextTo
                               (&this->super_BaseRAPass,first,
                                &((this->super_BaseRAPass)._func)->_exitNode->super_BaseNode);
            if (!bVar14) {
              ((this->super_BaseRAPass).super_FuncPass.super_Pass._cb)->_cursor =
                   (first->field_0).field_0._prev;
              local_3c = ((this->super_BaseRAPass)._func)->_exitNode->_labelId;
              local_40 = 4;
              local_38 = 0;
              EVar16 = (*(this->super_BaseRAPass).super_FuncPass.super_Pass._vptr_Pass[0xd])
                                 (this,&local_40);
              if (EVar16 != 0) {
                return EVar16;
              }
            }
            pBVar11 = (first->field_0).field_0._prev;
            BaseBuilder::removeNode((this->super_BaseRAPass).super_FuncPass.super_Pass._cb,first);
            *(BaseNode **)(lVar20 + 0x18) = pBVar11;
          }
        }
        if (bVar2 != 0) {
          pBVar8 = (this->super_BaseRAPass).super_FuncPass.super_Pass._cb;
          lVar20 = 0;
          do {
            uVar5 = *(uint *)((long)&first[1].field_1 + lVar20);
            if ((uVar5 & 0x2007) == 0x2002) {
              uVar18 = *(int *)((long)&first[1]._position + lVar20) - 0x100;
              if (uVar4 <= uVar18) {
                return 0x1e;
              }
              if (uVar18 < *(uint *)&pBVar8[1].super_BaseEmitter._code) {
                lVar9 = *(long *)(*(long *)(*(long *)&pBVar8[1].super_BaseEmitter._privateData +
                                           (ulong)uVar18 * 8) + 0x28);
                if (lVar9 != 0) {
                  pbVar10 = *(byte **)(lVar9 + 0x18);
                  iVar17 = *(int *)(pbVar10 + 0x10);
                  uVar18 = (this->super_BaseRAPass)._sp.super_Operand.super_Operand_._signature.
                           _bits;
                  *(uint *)((long)&first[1]._position + lVar20) = (uint)*pbVar10;
                  *(uint *)((long)&first[1].field_1 + lVar20) = uVar5 & 0xffffdf02 | uVar18 & 0xf8;
                  piVar1 = (int *)((long)&first[1].field_3 + lVar20 + 4);
                  *piVar1 = *piVar1 + iVar17;
                  goto LAB_0014773a;
                }
              }
              else {
                _rewrite();
              }
              _rewrite();
              goto LAB_00147831;
            }
LAB_0014773a:
            lVar20 = lVar20 + 0x10;
          } while ((ulong)bVar2 * 0x10 != lVar20);
        }
      }
LAB_00147747:
      first = pBVar6;
    } while (pBVar6 != stop);
  }
  return 0;
}

Assistant:

ASMJIT_FAVOR_SPEED Error X86RAPass::_rewrite(BaseNode* first, BaseNode* stop) noexcept {
  uint32_t virtCount = cc()->_vRegArray.size();

  BaseNode* node = first;
  while (node != stop) {
    BaseNode* next = node->next();
    if (node->isInst()) {
      InstNode* inst = node->as<InstNode>();
      RAInst* raInst = node->passData<RAInst>();

      Operand* operands = inst->operands();
      uint32_t opCount = inst->opCount();
      uint32_t maxRegId = 0;

      uint32_t i;

      // Rewrite virtual registers into physical registers.
      if (raInst) {
        // This data is allocated by Zone passed to `runOnFunction()`, which will be reset after the RA pass finishes.
        // So reset this data to prevent having a dead pointer after the RA pass is complete.
        node->resetPassData();

        // If the instruction contains pass data (raInst) then it was a subject for register allocation and must be
        // rewritten to use physical regs.
        RATiedReg* tiedRegs = raInst->tiedRegs();
        uint32_t tiedCount = raInst->tiedCount();

        for (i = 0; i < tiedCount; i++) {
          RATiedReg* tiedReg = &tiedRegs[i];

          Support::BitWordIterator<uint32_t> useIt(tiedReg->useRewriteMask());
          uint32_t useId = tiedReg->useId();
          while (useIt.hasNext()) {
            maxRegId = Support::max(maxRegId, useId);
            inst->rewriteIdAtIndex(useIt.next(), useId);
          }

          Support::BitWordIterator<uint32_t> outIt(tiedReg->outRewriteMask());
          uint32_t outId = tiedReg->outId();
          while (outIt.hasNext()) {
            maxRegId = Support::max(maxRegId, outId);
            inst->rewriteIdAtIndex(outIt.next(), outId);
          }
        }

        // Transform VEX instruction to EVEX when necessary.
        if (raInst->isTransformable()) {
          if (maxRegId > 15) {
            inst->setId(transformVexToEvex(inst->id()));
          }
        }

        // Remove moves that do not do anything.
        //
        // Usually these moves are inserted during code generation and originally they used different registers. If RA
        // allocated these into the same register such redundant mov would appear.
        if (raInst->hasInstRWFlag(InstRWFlags::kMovOp) && !inst->hasExtraReg()) {
          if (inst->opCount() == 2) {
            if (inst->op(0) == inst->op(1)) {
              cc()->removeNode(node);
              goto Next;
            }
          }
        }

        if (ASMJIT_UNLIKELY(node->type() != NodeType::kInst)) {
          // FuncRet terminates the flow, it must either be removed if the exit label is next to it (optimization) or
          // patched to an architecture dependent jump instruction that jumps to the function's exit before the epilog.
          if (node->type() == NodeType::kFuncRet) {
            RABlock* block = raInst->block();
            if (!isNextTo(node, _func->exitNode())) {
              cc()->_setCursor(node->prev());
              ASMJIT_PROPAGATE(emitJump(_func->exitNode()->label()));
            }

            BaseNode* prev = node->prev();
            cc()->removeNode(node);
            block->setLast(prev);
          }
        }
      }

      // Rewrite stack slot addresses.
      for (i = 0; i < opCount; i++) {
        Operand& op = operands[i];
        if (op.isMem()) {
          BaseMem& mem = op.as<BaseMem>();
          if (mem.isRegHome()) {
            uint32_t virtIndex = Operand::virtIdToIndex(mem.baseId());
            if (ASMJIT_UNLIKELY(virtIndex >= virtCount))
              return DebugUtils::errored(kErrorInvalidVirtId);

            VirtReg* virtReg = cc()->virtRegByIndex(virtIndex);
            RAWorkReg* workReg = virtReg->workReg();
            ASMJIT_ASSERT(workReg != nullptr);

            RAStackSlot* slot = workReg->stackSlot();
            int32_t offset = slot->offset();

            mem._setBase(_sp.type(), slot->baseRegId());
            mem.clearRegHome();
            mem.addOffsetLo32(offset);
          }
        }
      }
    }

Next:
    node = next;
  }

  return kErrorOk;
}